

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

bool validate_throws(t_struct *throws)

{
  pointer pptVar1;
  pointer pptVar2;
  int iVar3;
  t_type *ptVar4;
  pointer pptVar5;
  
  pptVar2 = (throws->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pptVar5 = pptVar2;
    pptVar1 = (throws->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pptVar5 == pptVar1) break;
    ptVar4 = t_type::get_true_type((*pptVar5)->type_);
    iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[0xc])(ptVar4);
    pptVar2 = pptVar5 + 1;
  } while ((char)iVar3 != '\0');
  return pptVar5 == pptVar1;
}

Assistant:

bool validate_throws(t_struct *throws) {
    const vector<t_field *> &members = throws->get_members();
    vector<t_field *>::const_iterator m_iter;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        if (!t_generator::get_true_type((*m_iter)->get_type())->is_xception()) {
            return false;
        }
    }
    return true;
}